

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_manyvector.c
# Opt level: O2

int N_VInvTestLocal_ManyVector(N_Vector x,N_Vector z)

{
  long lVar1;
  int iVar2;
  uint uVar3;
  sunindextype i;
  long lVar4;
  
  uVar3 = 1;
  lVar4 = 0;
  while( true ) {
    if (*x->content <= lVar4) break;
    lVar1 = *(long *)(*(long *)((long)x->content + 0x10) + lVar4 * 8);
    if (*(long *)(*(long *)(lVar1 + 8) + 0x160) == 0) {
      iVar2 = N_VInvTest(lVar1,*(undefined8 *)(*(long *)((long)z->content + 0x10) + lVar4 * 8));
    }
    else {
      iVar2 = N_VInvTestLocal();
    }
    uVar3 = (uint)(iVar2 != 0 && uVar3 != 0);
    lVar4 = lVar4 + 1;
  }
  return uVar3;
}

Assistant:

sunbooleantype MVAPPEND(N_VInvTestLocal)(N_Vector x, N_Vector z)
{
  SUNFunctionBegin(x->sunctx);
  sunindextype i;
  sunbooleantype val, subval;

  /* initialize output*/
  val = SUNTRUE;

  for (i = 0; i < MANYVECTOR_NUM_SUBVECS(x); i++)
  {
    /* check for nvinvtestlocal in subvector */
    if (MANYVECTOR_SUBVEC(x, i)->ops->nvinvtestlocal)
    {
      subval = N_VInvTestLocal(MANYVECTOR_SUBVEC(x, i), MANYVECTOR_SUBVEC(z, i));
      SUNCheckLastErrNoRet();
      val = (val && subval);

      /* otherwise, call nvinvtest and accumulate to overall val */
    }
    else
    {
      subval = N_VInvTest(MANYVECTOR_SUBVEC(x, i), MANYVECTOR_SUBVEC(z, i));
      SUNCheckLastErrNoRet();
      val = (val && subval);
    }
  }

  return (val);
}